

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  size_type sVar4;
  Location local_228;
  Var local_208;
  Location local_1c0;
  Var local_1a0;
  Location local_158;
  Enum local_138;
  Enum local_134;
  Enum local_130;
  u32 local_12c;
  u32 local_128;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  FuncType *func_type;
  Var local_f8;
  Location local_b0;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index table_index_local;
  Index sig_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = table_index;
  local_1c = sig_index;
  _table_index_local = this;
  GetLocation(&local_48,this);
  IVar2 = local_1c;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,IVar2,&local_b0);
  IVar1 = local_20;
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_f8,IVar1,(Location *)&func_type);
  local_24 = (Enum)SharedValidator::OnReturnCallIndirect
                             (&this->validator_,&local_48,&local_90,&local_f8);
  bVar3 = Failed((Result)local_24);
  Var::~Var(&local_f8);
  Var::~Var(&local_90);
  if (bVar3) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    _keep_count = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                  operator[](&this->module_->func_types,(ulong)local_1c);
    local_130 = (Enum)GetReturnCallDropKeepCount(this,_keep_count,1,&catch_drop_count,&local_128);
    bVar3 = Failed((Result)local_130);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      sVar4 = std::
              vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
              ::size(&this->label_stack_);
      local_134 = (Enum)SharedValidator::GetCatchCount(&this->validator_,(int)sVar4 - 1,&local_12c);
      bVar3 = Failed((Result)local_134);
      if (bVar3) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        GetLocation(&local_158,this);
        IVar2 = local_1c;
        GetLocation(&local_1c0,this);
        Var::Var(&local_1a0,IVar2,&local_1c0);
        IVar1 = local_20;
        GetLocation(&local_228,this);
        Var::Var(&local_208,IVar1,&local_228);
        local_138 = (Enum)SharedValidator::OnReturnCallIndirect
                                    (&this->validator_,&local_158,&local_1a0,&local_208);
        bVar3 = Failed((Result)local_138);
        Var::~Var(&local_208);
        Var::~Var(&local_1a0);
        if (bVar3) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          Istream::EmitDropKeep(this->istream_,catch_drop_count,local_128);
          Istream::EmitCatchDrop(this->istream_,local_12c);
          Istream::Emit(this->istream_,ReturnCallIndirect,local_20,local_1c);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));

  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count, catch_drop_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}